

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O2

void __thiscall
Am_Drawonable_Impl::Draw_Lines
          (Am_Drawonable_Impl *this,Am_Style *ls,Am_Style *fs,Am_Point_Array *pts,Am_Draw_Function f
          )

{
  uint *puVar1;
  XPoint *ar;
  Am_Point_Array_Data *pAVar2;
  
  pAVar2 = pts->data;
  if (pAVar2 != (Am_Point_Array_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar2 = Am_Point_Array_Data::Narrow(&pAVar2->super_Am_Wrapper);
  if (pAVar2 != (Am_Point_Array_Data *)0x0) {
    ar = (pAVar2->points).super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
         super__Vector_impl_data._M_start;
    poly_draw_it(this,ls,fs,f,ar,
                 (int)((ulong)((long)(pAVar2->points).
                                     super__Vector_base<XPoint,_std::allocator<XPoint>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ar) >> 2));
    Am_Wrapper::Release(&pAVar2->super_Am_Wrapper);
    return;
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Draw_Lines(const Am_Style &ls, const Am_Style &fs,
                               const Am_Point_Array &pts, Am_Draw_Function f)
{
  Am_Point_Array_Data *data = Am_Point_Array_Data::Narrow(pts);

  if (data) {
    poly_draw_it(ls, fs, f, &data->points[0], (int)data->points.size());
    data->Release();
  }
}